

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O2

void __thiscall Client::handleLogoutRequest(Client *this,LogoutRequest *request)

{
  User *this_00;
  CommunicationStack *pCVar1;
  __type _Var2;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *this_01;
  Event EVar3;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_40;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_30;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_20;
  
  if (this->user == (User *)0x0) {
    pCVar1 = this->communicationStack;
    EVar3 = LogoutResponse::operator_cast_to_basic_json((LogoutResponse *)&local_20);
    (*(pCVar1->super_IONotifiable)._vptr_IONotifiable[3])(pCVar1,&local_20,EVar3.m_value.object);
    this_01 = &local_20;
  }
  else {
    _Var2 = std::operator==(&this->user->username,&request->username);
    if (_Var2) {
      this_00 = this->user;
      if (this_00 != (User *)0x0) {
        User::~User(this_00);
      }
      operator_delete(this_00);
      this->user = (User *)0x0;
      pCVar1 = this->communicationStack;
      EVar3 = LogoutResponse::operator_cast_to_basic_json((LogoutResponse *)&local_30);
      (*(pCVar1->super_IONotifiable)._vptr_IONotifiable[3])(pCVar1,&local_30,EVar3.m_value.object);
      this_01 = &local_30;
    }
    else {
      pCVar1 = this->communicationStack;
      EVar3 = LogoutResponse::operator_cast_to_basic_json((LogoutResponse *)&local_40);
      (*(pCVar1->super_IONotifiable)._vptr_IONotifiable[3])(pCVar1,&local_40,EVar3.m_value.object);
      this_01 = &local_40;
    }
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(this_01);
  return;
}

Assistant:

void Client::handleLogoutRequest(LogoutRequest request)
{
	if(user == nullptr)
	{
		communicationStack->sendEvent(LogoutResponse(false));
		return;
	}

	if(user->getUsername() == request.username)
	{
		delete user;
		user = nullptr;
		communicationStack->sendEvent(LogoutResponse(true));
	}
	else
	{
		communicationStack->sendEvent(LogoutResponse(false));
	}
}